

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::WebSocket,_std::nullptr_t> __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  long *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  Header *pHVar7;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *extraout_RDX_01;
  WebSocket *pWVar8;
  void *in_R8;
  long lVar9;
  Own<kj::WebSocket,_std::nullptr_t> OVar10;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  undefined8 *local_c0;
  ArrayDisposer *local_b8;
  OwnPromiseNode local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  undefined1 local_80 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_58;
  Header *local_50;
  
  HttpHeaders::clone((HttpHeaders *)local_80,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&local_c0,(HttpHeaders *)local_80);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_80);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_80._0_8_ = &headers->indexedHeaders;
  local_80._8_8_ = headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<void> *)&local_b0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&(headers->unindexedHeaders).builder.pos);
  pHVar7 = (Header *)operator_new(0x30);
  uVar6 = local_80._8_8_;
  (pHVar7->name).content.ptr = (char *)&PTR_send_006d9bf0;
  uVar4 = (undefined4)uStack_a0;
  uVar5 = uStack_a0._4_4_;
  uStack_a0 = 0;
  *(undefined4 *)&(pHVar7->name).content.size_ = local_a8;
  *(undefined4 *)((long)&(pHVar7->name).content.size_ + 4) = uStack_a4;
  *(undefined4 *)&(pHVar7->value).content.ptr = uVar4;
  *(undefined4 *)((long)&(pHVar7->value).content.ptr + 4) = uVar5;
  *(undefined1 *)&(pHVar7->value).content.size_ = 1;
  pHVar7[1].name.content.ptr = (char *)local_b0.ptr;
  *(undefined2 *)&pHVar7[1].name.content.size_ = 0;
  if ((HttpHeaders *)local_80._8_8_ != (HttpHeaders *)0x0) {
    local_80._8_8_ = (StringPtr *)0x0;
    (*(code *)(((((Vector<kj::StringPtr> *)local_80._0_8_)->builder).ptr)->content).ptr)
              (local_80._0_8_,
               (long)(HttpHeaderTable **)uVar6 +
               (long)(*(HttpHeaderTable **)uVar6)[-1].idsByName.ptr);
  }
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_80._0_4_ = 0x65;
  local_80._8_8_ = "Switching Protocols";
  local_80._16_8_ = 0x14;
  local_80._24_8_ = local_b8;
  local_58 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x28);
  (local_58->name).content.size_ = (size_t)local_c0;
  (local_58->value).content.ptr = (char *)local_b8;
  local_b8 = (ArrayDisposer *)0x0;
  (local_58->value).content.size_ =
       (size_t)&kj::_::
                HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>::
                instance;
  local_58[1].name.content.ptr = (char *)pHVar7;
  (local_58->name).content.ptr = (char *)&PTR_disposeImpl_006dc758;
  local_80._32_4_ = 2;
  local_50 = pHVar7;
  (**(code **)((pHVar2->name).content.ptr + 0x10))(pHVar2,local_80);
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
  destroy((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
           *)(local_80 + 0x20));
  *(undefined4 *)&(this->super_Response)._vptr_Response = local_98;
  *(undefined4 *)((long)&(this->super_Response)._vptr_Response + 4) = uStack_94;
  *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = (undefined4)uStack_90;
  *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
       uStack_90._4_4_;
  uStack_90 = 0;
  lVar9 = 0x10;
  pWVar8 = extraout_RDX;
  do {
    plVar3 = *(long **)((long)&uStack_a0 + lVar9);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)&uStack_a0 + lVar9) = 0;
      (**(code **)**(undefined8 **)((long)&local_a8 + lVar9))
                (*(undefined8 **)((long)&local_a8 + lVar9),(long)plVar3 + *(long *)(*plVar3 + -0x10)
                );
      pWVar8 = extraout_RDX_00;
    }
    lVar9 = lVar9 + -0x10;
  } while (lVar9 != -0x10);
  if (local_b8 != (ArrayDisposer *)0x0) {
    local_b8 = (ArrayDisposer *)0x0;
    (**(code **)*local_c0)();
    pWVar8 = extraout_RDX_01;
  }
  OVar10.ptr = pWVar8;
  OVar10.disposer = (Disposer *)this;
  return OVar10;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }